

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O0

void __thiscall
cinatra::coro_http_server::
set_http_handler<(cinatra::http_method)1,(cinatra::http_method)3,DOCTEST_ANON_FUNC_61()::__1>
          (void *param_1,undefined8 param_2)

{
  coro_http_router *this;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  undefined1 local_38 [32];
  undefined8 local_18;
  void *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  std::__cxx11::string::string(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  coro_http_router::set_http_handler<(cinatra::http_method)1,DOCTEST_ANON_FUNC_61()::__1>
            ((coro_http_router *)((long)param_1 + 0x268),local_38);
  this = (coro_http_router *)((long)param_1 + 0x268);
  std::__cxx11::string::string(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  coro_http_router::set_http_handler<(cinatra::http_method)3,DOCTEST_ANON_FUNC_61()::__1>
            (this,local_70);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  return;
}

Assistant:

void set_http_handler(std::string key, Func handler, Aspects &&...asps) {
    static_assert(sizeof...(method) >= 1, "must set http_method");
    if constexpr (sizeof...(method) == 1) {
      (router_.set_http_handler<method>(std::move(key), std::move(handler),
                                        std::forward<Aspects>(asps)...),
       ...);
    }
    else {
      (router_.set_http_handler<method>(key, handler,
                                        std::forward<Aspects>(asps)...),
       ...);
    }
  }